

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O2

void __thiscall embree::AccelN::accels_print(AccelN *this,size_t ident)

{
  ostream *poVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  
  for (uVar3 = 0; sVar2 = ident,
      uVar3 < (ulong)((long)(this->accels).
                            super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->accels).
                            super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
      std::operator<<((ostream *)&std::cout," ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"accels[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"]");
    std::endl<char,std::char_traits<char>>(poVar1);
    Accel::Intersectors::print
              ((Intersectors *)
               &((this->accels).
                 super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3]->super_AccelData).field_0x58,ident + 2);
  }
  return;
}

Assistant:

void AccelN::accels_print(size_t ident)
  {
    for (size_t i=0; i<accels.size(); i++)
    {
      for (size_t j=0; j<ident; j++) std::cout << " "; 
      std::cout << "accels[" << i << "]" << std::endl;
      accels[i]->intersectors.print(ident+2);
    }
  }